

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O0

void double_90_suite::test_linear_increase(void)

{
  undefined8 local_1b8;
  value_type_conflict local_1b0 [2];
  undefined8 local_1a0;
  value_type_conflict local_198 [2];
  undefined8 local_188;
  value_type_conflict local_180 [2];
  undefined8 local_170;
  value_type_conflict local_168 [2];
  undefined8 local_158;
  value_type_conflict local_150 [2];
  undefined8 local_140;
  value_type_conflict local_138 [2];
  undefined8 local_128;
  value_type_conflict local_120 [2];
  undefined8 local_110;
  value_type_conflict local_108 [2];
  undefined8 local_f8;
  value_type_conflict local_f0 [2];
  undefined8 local_e0;
  value_type_conflict local_d8 [2];
  undefined8 local_c8;
  value_type_conflict local_c0 [2];
  undefined1 local_b0 [8];
  psquare<double,_std::ratio<9L,_10L>_> quantile;
  
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::psquare
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,1.0);
  local_c0[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_c8 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x331,"void double_90_suite::test_linear_increase()",local_c0,&local_c8);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,2.0);
  local_d8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_e0 = 0x3ffe666666666666;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","1.9",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x333,"void double_90_suite::test_linear_increase()",local_d8,&local_e0);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,3.0);
  local_f0[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_f8 = 0x4006666666666666;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","2.8",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x335,"void double_90_suite::test_linear_increase()",local_f0,&local_f8);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,4.0);
  local_108[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_110 = 0x400d99999999999a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","3.7",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x337,"void double_90_suite::test_linear_increase()",local_108,&local_110);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,5.0);
  local_120[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_128 = 0x4012666666666666;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","4.6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x339,"void double_90_suite::test_linear_increase()",local_120,&local_128);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,6.0);
  local_138[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_140 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x33e,"void double_90_suite::test_linear_increase()",local_138,&local_140);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,7.0);
  local_150[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_158 = 0x4010000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","4.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x340,"void double_90_suite::test_linear_increase()",local_150,&local_158);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,8.0);
  local_168[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_170 = 0x4014000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","5.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x342,"void double_90_suite::test_linear_increase()",local_168,&local_170);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,9.0);
  local_180[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_188 = 0x4018000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","6.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x344,"void double_90_suite::test_linear_increase()",local_180,&local_188);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,10.0);
  local_198[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_1a0 = 0x401c000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","7.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x346,"void double_90_suite::test_linear_increase()",local_198,&local_1a0);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push
            ((psquare<double,_std::ratio<9L,_10L>_> *)local_b0,11.0);
  local_1b0[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::
                 value<std::ratio<9l,10l>>((psquare<double,std::ratio<9l,10l>> *)local_b0);
  local_1b8 = 0x4020000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","8.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x348,"void double_90_suite::test_linear_increase()",local_1b0,&local_1b8);
  return;
}

Assistant:

void test_linear_increase()
{
    quantile::psquare<double, upper_decile_ratio> quantile;
    quantile.push(1.0);
    TRIAL_TEST_EQ(quantile.value(), 1.0);
    quantile.push(2.0);
    TRIAL_TEST_EQ(quantile.value(), 1.9);
    quantile.push(3.0);
    TRIAL_TEST_EQ(quantile.value(), 2.8);
    quantile.push(4.0);
    TRIAL_TEST_EQ(quantile.value(), 3.7);
    quantile.push(5.0);
    TRIAL_TEST_EQ(quantile.value(), 4.6);

    // Switch to approximation

    quantile.push(6.0);
    TRIAL_TEST_EQ(quantile.value(), 3.0); // 5.5
    quantile.push(7.0);
    TRIAL_TEST_EQ(quantile.value(), 4.0); // 6.4
    quantile.push(8.0);
    TRIAL_TEST_EQ(quantile.value(), 5.0); // 7.3
    quantile.push(9.0);
    TRIAL_TEST_EQ(quantile.value(), 6.0); // 8.2
    quantile.push(10.0);
    TRIAL_TEST_EQ(quantile.value(), 7.0); // 9.1
    quantile.push(11.0);
    TRIAL_TEST_EQ(quantile.value(), 8.0); // 10.0
}